

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O0

void decode_256(FILE *f,uint w,uint h)

{
  uchar *puVar1;
  uchar *local_30;
  uchar *ptr;
  uint y;
  uint x;
  uint c;
  uint i;
  uint h_local;
  uint w_local;
  FILE *f_local;
  
  local_30 = pcx_buf;
  ptr._4_4_ = 0;
  ptr._0_4_ = 0;
  if (pcx.encoding == '\0') {
    fread(pcx_buf,(ulong)w,(ulong)h,(FILE *)f);
    fgetc((FILE *)f);
  }
  else if (pcx.encoding == '\x01') {
    do {
      y = fgetc((FILE *)f);
      if (y == 0xffffffff) break;
      if ((y & 0xc0) == 0xc0) {
        x = y & 0x3f;
        y = fgetc((FILE *)f);
      }
      else {
        x = 1;
      }
      do {
        ptr._4_4_ = ptr._4_4_ + 1;
        puVar1 = local_30 + 1;
        *local_30 = (uchar)y;
        if (ptr._4_4_ == w) {
          ptr._4_4_ = 0;
          ptr._0_4_ = (uint)ptr + 1;
        }
        x = x - 1;
        local_30 = puVar1;
      } while (x != 0);
    } while ((uint)ptr < h);
    if (y != 0xffffffff) {
      y = fgetc((FILE *)f);
    }
    while (y != 0xc && y != 0xffffffff) {
      y = fgetc((FILE *)f);
    }
    if (y == 0xc) {
      fread(pcx_pal,0x300,1,(FILE *)f);
    }
    pcx_nb_colors = 0x100;
  }
  else {
    error("Unsupported PCX encoding scheme!");
  }
  return;
}

Assistant:

void
decode_256(FILE *f, unsigned int w, unsigned int h)
{
	unsigned int   i, c, x, y;
	unsigned char *ptr;

	ptr = pcx_buf;
	x = 0;
	y = 0;

	/* decode */
	switch (pcx.encoding) {
	case 0:
		/* raw */
		fread(pcx_buf, w, h, f);
		c = fgetc(f);
		return;

	case 1:
		/* simple run-length encoding */
		do {
			c = fgetc(f);
			if (c ==  uEOF)
				break;
			if ((c & 0xC0) != 0xC0)
				i = 1;
			else {
				i = (c & 0x3F);
				c = fgetc(f);
			}
			do {
				x++;
			   *ptr++ = c;
				if (x == w) {
					x = 0;
					y++;
				}
			} while (--i);
		} while (y < h);
		break;

	default:
		error("Unsupported PCX encoding scheme!");
		return;
	}			

	/* get the palette */
	if (c != uEOF)
		c = fgetc(f);
	while ((c != 12) && (c != uEOF))
		c = fgetc(f);
	if (c == 12)
		fread(pcx_pal, 768, 1, f);

	/* number of colors */
	pcx_nb_colors = 256;
}